

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-lexer.cpp
# Opt level: O0

void __thiscall LexerTest_LexHexFloat_Test::TestBody(LexerTest_LexHexFloat_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  _Storage<double,_true> extraout_XMM0_Qa;
  _Storage<double,_true> extraout_XMM0_Qa_00;
  _Storage<double,_true> extraout_XMM0_Qa_01;
  _Storage<double,_true> extraout_XMM0_Qa_02;
  _Storage<double,_true> extraout_XMM0_Qa_03;
  _Storage<double,_true> extraout_XMM0_Qa_04;
  _Storage<double,_true> extraout_XMM0_Qa_05;
  _Storage<double,_true> extraout_XMM0_Qa_06;
  _Storage<double,_true> extraout_XMM0_Qa_07;
  _Storage<double,_true> extraout_XMM0_Qa_08;
  _Storage<double,_true> extraout_XMM0_Qa_09;
  _Storage<double,_true> extraout_XMM0_Qa_10;
  _Storage<double,_true> extraout_XMM0_Qa_11;
  _Storage<double,_true> extraout_XMM0_Qa_12;
  _Storage<double,_true> extraout_XMM0_Qa_13;
  undefined8 extraout_XMM0_Qa_14;
  undefined8 extraout_XMM0_Qa_15;
  undefined8 extraout_XMM0_Qa_16;
  undefined8 extraout_XMM0_Qa_17;
  undefined8 extraout_XMM0_Qa_18;
  undefined8 extraout_XMM0_Qa_19;
  undefined8 extraout_XMM0_Qa_20;
  undefined8 extraout_XMM0_Qa_21;
  undefined8 extraout_XMM0_Qa_22;
  undefined8 extraout_XMM0_Qa_23;
  undefined8 extraout_XMM0_Qa_24;
  undefined8 extraout_XMM0_Qa_25;
  undefined8 extraout_XMM0_Qa_26;
  undefined8 extraout_XMM0_Qa_27;
  undefined8 extraout_XMM0_Qa_28;
  undefined8 extraout_XMM0_Qa_29;
  undefined8 extraout_XMM0_Qa_30;
  string local_36e8;
  AssertHelper local_36c8;
  Message local_36c0 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_36b0;
  string_view local_3688;
  Lexer local_3678;
  undefined8 local_3620;
  undefined1 local_3618;
  bool local_3609;
  undefined1 local_3608 [8];
  AssertionResult gtest_ar__33;
  AssertHelper local_35d8;
  Message local_35d0 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_35c0;
  string_view local_3598;
  Lexer local_3588;
  undefined8 local_352c;
  bool local_3521;
  undefined1 local_3520 [8];
  AssertionResult gtest_ar__32;
  AssertHelper local_34f0;
  Message local_34e8 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_34d8;
  string_view local_34b0;
  Lexer local_34a0;
  undefined8 local_3448;
  undefined1 local_3440;
  bool local_3431;
  undefined1 local_3430 [8];
  AssertionResult gtest_ar__31;
  AssertHelper local_3400;
  Message local_33f8 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_33e8;
  string_view local_33c0;
  Lexer local_33b0;
  undefined8 local_3354;
  bool local_3349;
  undefined1 local_3348 [8];
  AssertionResult gtest_ar__30;
  AssertHelper local_3318;
  Message local_3310 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3300;
  string_view local_32d8;
  Lexer local_32c8;
  undefined8 local_3270;
  undefined1 local_3268;
  bool local_3259;
  undefined1 local_3258 [8];
  AssertionResult gtest_ar__29;
  AssertHelper local_3228;
  Message local_3220 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3210;
  string_view local_31e8;
  Lexer local_31d8;
  undefined8 local_317c;
  bool local_3171;
  undefined1 local_3170 [8];
  AssertionResult gtest_ar__28;
  AssertHelper local_3140;
  Message local_3138 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3128;
  string_view local_3100;
  Lexer local_30f0;
  undefined8 local_3098;
  undefined1 local_3090;
  bool local_3081;
  undefined1 local_3080 [8];
  AssertionResult gtest_ar__27;
  AssertHelper local_3050;
  Message local_3048 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3038;
  string_view local_3010;
  Lexer local_3000;
  undefined8 local_2fa4;
  bool local_2f99;
  undefined1 local_2f98 [8];
  AssertionResult gtest_ar__26;
  AssertHelper local_2f68;
  Message local_2f60 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2f50;
  string_view local_2f28;
  Lexer local_2f18;
  undefined8 local_2ec0;
  undefined1 local_2eb8;
  bool local_2ea9;
  undefined1 local_2ea8 [8];
  AssertionResult gtest_ar__25;
  AssertHelper local_2e78;
  Message local_2e70 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2e60;
  string_view local_2e38;
  Lexer local_2e28;
  undefined8 local_2dcc;
  bool local_2dc1;
  undefined1 local_2dc0 [8];
  AssertionResult gtest_ar__24;
  AssertHelper local_2d90;
  Message local_2d88 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2d78;
  string_view local_2d50;
  Lexer local_2d40;
  undefined8 local_2ce8;
  undefined1 local_2ce0;
  bool local_2cd1;
  undefined1 local_2cd0 [8];
  AssertionResult gtest_ar__23;
  AssertHelper local_2ca0;
  Message local_2c98 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2c88;
  string_view local_2c60;
  Lexer local_2c50;
  undefined8 local_2bf4;
  bool local_2be9;
  undefined1 local_2be8 [8];
  AssertionResult gtest_ar__22;
  AssertHelper local_2bb8;
  Message local_2bb0 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2ba0;
  string_view local_2b78;
  Lexer local_2b68;
  undefined8 local_2b10;
  undefined1 local_2b08;
  bool local_2af9;
  undefined1 local_2af8 [8];
  AssertionResult gtest_ar__21;
  AssertHelper local_2ac8;
  Message local_2ac0 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2ab0;
  string_view local_2a88;
  Lexer local_2a78;
  undefined8 local_2a1c;
  bool local_2a11;
  undefined1 local_2a10 [8];
  AssertionResult gtest_ar__20;
  AssertHelper local_29e0;
  Message local_29d8 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_29c8;
  string_view local_29a0;
  Lexer local_2990;
  undefined8 local_2938;
  undefined1 local_2930;
  bool local_2921;
  undefined1 local_2920 [8];
  AssertionResult gtest_ar__19;
  AssertHelper local_28f0;
  Message local_28e8 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28d8;
  string_view local_28b0;
  Lexer local_28a0;
  undefined8 local_2844;
  bool local_2839;
  undefined1 local_2838 [8];
  AssertionResult gtest_ar__18;
  AssertHelper local_2808;
  Message local_2800 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_27f0;
  string_view local_27c8;
  Lexer local_27b8;
  undefined8 local_2760;
  undefined1 local_2758;
  bool local_2749;
  undefined1 local_2748 [8];
  AssertionResult gtest_ar__17;
  AssertHelper local_2718;
  Message local_2710 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2700;
  string_view local_26d8;
  Lexer local_26c8;
  undefined8 local_266c;
  bool local_2661;
  undefined1 local_2660 [8];
  AssertionResult gtest_ar__16;
  AssertHelper local_2630;
  Message local_2628 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2618;
  string_view local_25f0;
  Lexer local_25e0;
  undefined8 local_2588;
  undefined1 local_2580;
  bool local_2571;
  undefined1 local_2570 [8];
  AssertionResult gtest_ar__15;
  AssertHelper local_2540;
  Message local_2538 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2528;
  string_view local_2500;
  Lexer local_24f0;
  undefined8 local_2494;
  bool local_2489;
  undefined1 local_2488 [8];
  AssertionResult gtest_ar__14;
  AssertHelper local_2458;
  Message local_2450 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2440;
  string_view local_2418;
  Lexer local_2408;
  undefined8 local_23b0;
  undefined1 local_23a8;
  bool local_2399;
  undefined1 local_2398 [8];
  AssertionResult gtest_ar__13;
  AssertHelper local_2368;
  Message local_2360 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2350;
  string_view local_2328;
  Lexer local_2318;
  undefined8 local_22bc;
  bool local_22b1;
  undefined1 local_22b0 [8];
  AssertionResult gtest_ar__12;
  AssertHelper local_2280;
  Message local_2278 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2268;
  string_view local_2240;
  Lexer local_2230;
  undefined8 local_21d8;
  undefined1 local_21d0;
  bool local_21c1;
  undefined1 local_21c0 [8];
  AssertionResult gtest_ar__11;
  AssertHelper local_2190;
  Message local_2188 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2178;
  string_view local_2150;
  Lexer local_2140;
  undefined8 local_20e4;
  bool local_20d9;
  undefined1 local_20d8 [8];
  AssertionResult gtest_ar__10;
  AssertHelper local_20a8;
  Message local_20a0 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2090;
  string_view local_2068;
  Lexer local_2058;
  undefined8 local_2000;
  undefined1 local_1ff8;
  bool local_1fe9;
  undefined1 local_1fe8 [8];
  AssertionResult gtest_ar__9;
  AssertHelper local_1fb8;
  Message local_1fb0 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1fa0;
  string_view local_1f78;
  Lexer local_1f68;
  undefined8 local_1f0c;
  bool local_1f01;
  undefined1 local_1f00 [8];
  AssertionResult gtest_ar__8;
  AssertHelper local_1ed0;
  Message local_1ec8 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1eb8;
  string_view local_1e90;
  Lexer local_1e80;
  undefined8 local_1e28;
  undefined1 local_1e20;
  bool local_1e11;
  undefined1 local_1e10 [8];
  AssertionResult gtest_ar__7;
  AssertHelper local_1de0;
  Message local_1dd8 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1dc8;
  string_view local_1da0;
  Lexer local_1d90;
  undefined8 local_1d34;
  bool local_1d29;
  undefined1 local_1d28 [8];
  AssertionResult gtest_ar__6;
  AssertHelper local_1cf8;
  Message local_1cf0 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1ce0;
  string_view local_1cb8;
  Lexer local_1ca8;
  undefined8 local_1c50;
  undefined1 local_1c48;
  bool local_1c39;
  undefined1 local_1c38 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_1c08;
  Message local_1c00 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1bf0;
  string_view local_1bc8;
  Lexer local_1bb8;
  undefined8 local_1b5c;
  bool local_1b51;
  undefined1 local_1b50 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_1b20;
  Message local_1b18 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1b08;
  string_view local_1ae0;
  Lexer local_1ad0;
  undefined8 local_1a78;
  undefined1 local_1a70;
  bool local_1a61;
  undefined1 local_1a60 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_1a30;
  Message local_1a28 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1a18;
  string_view local_19f0;
  Lexer local_19e0;
  undefined8 local_1984;
  bool local_1979;
  undefined1 local_1978 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_1948;
  Message local_1940 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1930;
  string_view local_1908;
  Lexer local_18f8;
  undefined8 local_18a0;
  undefined1 local_1898;
  bool local_1889;
  undefined1 local_1888 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_1858;
  Message local_1850 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1840;
  string_view local_1818;
  Lexer local_1808;
  undefined8 local_17ac;
  bool local_17a1;
  undefined1 local_17a0 [8];
  AssertionResult gtest_ar_;
  Message local_1788;
  double local_1780 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1770;
  string_view local_1748;
  Lexer local_1738;
  _Storage<double,_true> local_16e0;
  undefined1 local_16d8;
  undefined1 local_16d0 [8];
  AssertionResult gtest_ar_29;
  Message local_16b8;
  float local_16b0 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_16a8;
  string_view local_1680;
  Lexer local_1670;
  _Optional_payload_base<float> local_1618;
  undefined1 local_1610 [8];
  AssertionResult gtest_ar_28;
  Message local_15f8;
  double local_15f0 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_15e0;
  string_view local_15b8;
  Lexer local_15a8;
  _Storage<double,_true> local_1550;
  undefined1 local_1548;
  undefined1 local_1540 [8];
  AssertionResult gtest_ar_27;
  Message local_1528;
  float local_1520 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1518;
  string_view local_14f0;
  Lexer local_14e0;
  _Optional_payload_base<float> local_1488;
  undefined1 local_1480 [8];
  AssertionResult gtest_ar_26;
  Message local_1468;
  double local_1460 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1450;
  string_view local_1428;
  Lexer local_1418;
  _Storage<double,_true> local_13c0;
  undefined1 local_13b8;
  undefined1 local_13b0 [8];
  AssertionResult gtest_ar_25;
  Message local_1398;
  float local_1390 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1388;
  string_view local_1360;
  Lexer local_1350;
  _Optional_payload_base<float> local_12f8;
  undefined1 local_12f0 [8];
  AssertionResult gtest_ar_24;
  Message local_12d8;
  double local_12d0 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_12c0;
  string_view local_1298;
  Lexer local_1288;
  _Storage<double,_true> local_1230;
  undefined1 local_1228;
  undefined1 local_1220 [8];
  AssertionResult gtest_ar_23;
  Message local_1208;
  float local_1200 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_11f8;
  string_view local_11d0;
  Lexer local_11c0;
  _Optional_payload_base<float> local_1168;
  undefined1 local_1160 [8];
  AssertionResult gtest_ar_22;
  Message local_1148;
  double local_1140 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1130;
  string_view local_1108;
  Lexer local_10f8;
  _Storage<double,_true> local_10a0;
  undefined1 local_1098;
  undefined1 local_1090 [8];
  AssertionResult gtest_ar_21;
  Message local_1078;
  float local_1070 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1068;
  string_view local_1040;
  Lexer local_1030;
  _Optional_payload_base<float> local_fd8;
  undefined1 local_fd0 [8];
  AssertionResult gtest_ar_20;
  Message local_fb8;
  double local_fb0 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_fa0;
  string_view local_f78;
  Lexer local_f68;
  _Storage<double,_true> local_f10;
  undefined1 local_f08;
  undefined1 local_f00 [8];
  AssertionResult gtest_ar_19;
  Message local_ee8;
  float local_ee0 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_ed8;
  string_view local_eb0;
  Lexer local_ea0;
  _Optional_payload_base<float> local_e48;
  undefined1 local_e40 [8];
  AssertionResult gtest_ar_18;
  Message local_e28;
  double local_e20 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e10;
  string_view local_de8;
  Lexer local_dd8;
  _Storage<double,_true> local_d80;
  undefined1 local_d78;
  undefined1 local_d70 [8];
  AssertionResult gtest_ar_17;
  Message local_d58;
  float local_d50 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d48;
  string_view local_d20;
  Lexer local_d10;
  _Optional_payload_base<float> local_cb8;
  undefined1 local_cb0 [8];
  AssertionResult gtest_ar_16;
  Message local_c98;
  double local_c90 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c80;
  string_view local_c58;
  Lexer local_c48;
  _Storage<double,_true> local_bf0;
  undefined1 local_be8;
  undefined1 local_be0 [8];
  AssertionResult gtest_ar_15;
  Message local_bc8;
  float local_bc0 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_bb8;
  string_view local_b90;
  Lexer local_b80;
  _Optional_payload_base<float> local_b28;
  undefined1 local_b20 [8];
  AssertionResult gtest_ar_14;
  Message local_b08;
  double local_b00 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_af0;
  string_view local_ac8;
  Lexer local_ab8;
  _Storage<double,_true> local_a60;
  undefined1 local_a58;
  undefined1 local_a50 [8];
  AssertionResult gtest_ar_13;
  Message local_a38;
  float local_a30 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a28;
  string_view local_a00;
  Lexer local_9f0;
  _Optional_payload_base<float> local_998;
  undefined1 local_990 [8];
  AssertionResult gtest_ar_12;
  Message local_978;
  double local_970 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_960;
  string_view local_938;
  Lexer local_928;
  _Storage<double,_true> local_8d0;
  undefined1 local_8c8;
  undefined1 local_8c0 [8];
  AssertionResult gtest_ar_11;
  Message local_8a8;
  float local_8a0 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_898;
  string_view local_870;
  Lexer local_860;
  _Optional_payload_base<float> local_808;
  undefined1 local_800 [8];
  AssertionResult gtest_ar_10;
  Message local_7e8;
  double local_7e0 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_7d0;
  string_view local_7a8;
  Lexer local_798;
  _Storage<double,_true> local_740;
  undefined1 local_738;
  undefined1 local_730 [8];
  AssertionResult gtest_ar_9;
  Message local_718;
  float local_710 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_708;
  string_view local_6e0;
  Lexer local_6d0;
  _Optional_payload_base<float> local_678;
  undefined1 local_670 [8];
  AssertionResult gtest_ar_8;
  Message local_658;
  double local_650 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_640;
  string_view local_618;
  Lexer local_608;
  _Storage<double,_true> local_5b0;
  undefined1 local_5a8;
  undefined1 local_5a0 [8];
  AssertionResult gtest_ar_7;
  Message local_588;
  float local_580 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_578;
  string_view local_550;
  Lexer local_540;
  _Optional_payload_base<float> local_4e8;
  undefined1 local_4e0 [8];
  AssertionResult gtest_ar_6;
  Message local_4c8;
  double local_4c0 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_4b0;
  string_view local_488;
  Lexer local_478;
  _Storage<double,_true> local_420;
  undefined1 local_418;
  undefined1 local_410 [8];
  AssertionResult gtest_ar_5;
  Message local_3f8;
  float local_3f0 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3e8;
  string_view local_3c0;
  Lexer local_3b0;
  _Optional_payload_base<float> local_358;
  undefined1 local_350 [8];
  AssertionResult gtest_ar_4;
  Message local_338;
  double local_330 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_320;
  string_view local_2f8;
  Lexer local_2e8;
  _Storage<double,_true> local_290;
  undefined1 local_288;
  undefined1 local_280 [8];
  AssertionResult gtest_ar_3;
  Message local_268;
  float local_260 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_258;
  string_view local_230;
  Lexer local_220;
  _Optional_payload_base<float> local_1c8;
  undefined1 local_1c0 [8];
  AssertionResult gtest_ar_2;
  Message local_1a8;
  double local_1a0 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_190;
  string_view local_168;
  Lexer local_158;
  _Storage<double,_true> local_100;
  undefined1 local_f8;
  undefined1 local_f0 [8];
  AssertionResult gtest_ar_1;
  Message local_d8;
  float local_d0 [6];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b8;
  string_view local_90;
  Lexer local_80;
  _Optional_payload_base<float> local_28;
  undefined1 local_20 [8];
  AssertionResult gtest_ar;
  LexerTest_LexHexFloat_Test *this_local;
  
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )this;
  local_90 = sv("0x4B",4);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_80,local_90,&local_b8);
  local_28 = (_Optional_payload_base<float>)::wasm::WATParser::Lexer::takeF32();
  local_d0[0] = 75.0;
  testing::internal::EqHelper::Compare<std::optional<float>,_float,_nullptr>
            ((EqHelper *)local_20,"Lexer(\"0x4B\"sv).takeF32()","0x4Bp0f",
             (optional<float> *)&local_28,local_d0);
  ::wasm::WATParser::Lexer::~Lexer(&local_80);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_b8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(&local_d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x245,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  local_168 = sv("0x4B",4);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_158,local_168,&local_190);
  local_f8 = ::wasm::WATParser::Lexer::takeF64();
  local_1a0[0] = 75.0;
  local_100 = extraout_XMM0_Qa;
  testing::internal::EqHelper::Compare<std::optional<double>,_double,_nullptr>
            ((EqHelper *)local_f0,"Lexer(\"0x4B\"sv).takeF64()","0x4Bp0",
             (optional<double> *)&local_100,local_1a0);
  ::wasm::WATParser::Lexer::~Lexer(&local_158);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_190);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f0);
  if (!bVar1) {
    testing::Message::Message(&local_1a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x246,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_1a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_1a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f0);
  local_230 = sv("0x4B.",5);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_220,local_230,&local_258);
  local_1c8 = (_Optional_payload_base<float>)::wasm::WATParser::Lexer::takeF32();
  local_260[0] = 75.0;
  testing::internal::EqHelper::Compare<std::optional<float>,_float,_nullptr>
            ((EqHelper *)local_1c0,"Lexer(\"0x4B.\"sv).takeF32()","0x4B.p0f",
             (optional<float> *)&local_1c8,local_260);
  ::wasm::WATParser::Lexer::~Lexer(&local_220);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_258);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c0);
  if (!bVar1) {
    testing::Message::Message(&local_268);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x248,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_268);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_268);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c0);
  local_2f8 = sv("0x4B.",5);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_2e8,local_2f8,&local_320);
  local_288 = ::wasm::WATParser::Lexer::takeF64();
  local_330[0] = 75.0;
  local_290 = extraout_XMM0_Qa_00;
  testing::internal::EqHelper::Compare<std::optional<double>,_double,_nullptr>
            ((EqHelper *)local_280,"Lexer(\"0x4B.\"sv).takeF64()","0x4B.p0",
             (optional<double> *)&local_290,local_330);
  ::wasm::WATParser::Lexer::~Lexer(&local_2e8);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_320);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_280);
  if (!bVar1) {
    testing::Message::Message(&local_338);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_280);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x249,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_338);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_338);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_280);
  local_3c0 = sv("0x4B.5",6);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_3b0,local_3c0,&local_3e8);
  local_358 = (_Optional_payload_base<float>)::wasm::WATParser::Lexer::takeF32();
  local_3f0[0] = 75.3125;
  testing::internal::EqHelper::Compare<std::optional<float>,_float,_nullptr>
            ((EqHelper *)local_350,"Lexer(\"0x4B.5\"sv).takeF32()","0x4B.5p0f",
             (optional<float> *)&local_358,local_3f0);
  ::wasm::WATParser::Lexer::~Lexer(&local_3b0);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_3e8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_350);
  if (!bVar1) {
    testing::Message::Message(&local_3f8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_350);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x24b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_3f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_3f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_350);
  local_488 = sv("0x4B.5",6);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_478,local_488,&local_4b0);
  local_418 = ::wasm::WATParser::Lexer::takeF64();
  local_4c0[0] = 75.3125;
  local_420 = extraout_XMM0_Qa_01;
  testing::internal::EqHelper::Compare<std::optional<double>,_double,_nullptr>
            ((EqHelper *)local_410,"Lexer(\"0x4B.5\"sv).takeF64()","0x4B.5p0",
             (optional<double> *)&local_420,local_4c0);
  ::wasm::WATParser::Lexer::~Lexer(&local_478);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_4b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_410);
  if (!bVar1) {
    testing::Message::Message(&local_4c8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_410);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x24c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_4c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_4c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_410);
  local_550 = sv("0x4Bp0",6);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_540,local_550,&local_578);
  local_4e8 = (_Optional_payload_base<float>)::wasm::WATParser::Lexer::takeF32();
  local_580[0] = 75.0;
  testing::internal::EqHelper::Compare<std::optional<float>,_float,_nullptr>
            ((EqHelper *)local_4e0,"Lexer(\"0x4Bp0\"sv).takeF32()","0x4Bp0f",
             (optional<float> *)&local_4e8,local_580);
  ::wasm::WATParser::Lexer::~Lexer(&local_540);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_578);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4e0);
  if (!bVar1) {
    testing::Message::Message(&local_588);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_4e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x24e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_588);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_588);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4e0);
  local_618 = sv("0x4Bp0",6);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_608,local_618,&local_640);
  local_5a8 = ::wasm::WATParser::Lexer::takeF64();
  local_650[0] = 75.0;
  local_5b0 = extraout_XMM0_Qa_02;
  testing::internal::EqHelper::Compare<std::optional<double>,_double,_nullptr>
            ((EqHelper *)local_5a0,"Lexer(\"0x4Bp0\"sv).takeF64()","0x4Bp0",
             (optional<double> *)&local_5b0,local_650);
  ::wasm::WATParser::Lexer::~Lexer(&local_608);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_640);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5a0);
  if (!bVar1) {
    testing::Message::Message(&local_658);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_5a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x24f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_658);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_658);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5a0);
  local_6e0 = sv("0x4B.p1",7);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_6d0,local_6e0,&local_708);
  local_678 = (_Optional_payload_base<float>)::wasm::WATParser::Lexer::takeF32();
  local_710[0] = 150.0;
  testing::internal::EqHelper::Compare<std::optional<float>,_float,_nullptr>
            ((EqHelper *)local_670,"Lexer(\"0x4B.p1\"sv).takeF32()","0x4B.p1f",
             (optional<float> *)&local_678,local_710);
  ::wasm::WATParser::Lexer::~Lexer(&local_6d0);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_708);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_670);
  if (!bVar1) {
    testing::Message::Message(&local_718);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_670);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x251,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_718);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_718);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_670);
  local_7a8 = sv("0x4B.p1",7);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_798,local_7a8,&local_7d0);
  local_738 = ::wasm::WATParser::Lexer::takeF64();
  local_7e0[0] = 150.0;
  local_740 = extraout_XMM0_Qa_03;
  testing::internal::EqHelper::Compare<std::optional<double>,_double,_nullptr>
            ((EqHelper *)local_730,"Lexer(\"0x4B.p1\"sv).takeF64()","0x4B.p1",
             (optional<double> *)&local_740,local_7e0);
  ::wasm::WATParser::Lexer::~Lexer(&local_798);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_7d0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_730);
  if (!bVar1) {
    testing::Message::Message(&local_7e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_730);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x252,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_7e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(&local_7e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_730);
  local_870 = sv("0x4BP1",6);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_860,local_870,&local_898);
  local_808 = (_Optional_payload_base<float>)::wasm::WATParser::Lexer::takeF32();
  local_8a0[0] = 150.0;
  testing::internal::EqHelper::Compare<std::optional<float>,_float,_nullptr>
            ((EqHelper *)local_800,"Lexer(\"0x4BP1\"sv).takeF32()","0x4BP1f",
             (optional<float> *)&local_808,local_8a0);
  ::wasm::WATParser::Lexer::~Lexer(&local_860);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_898);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_800);
  if (!bVar1) {
    testing::Message::Message(&local_8a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_800);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x254,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,&local_8a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
    testing::Message::~Message(&local_8a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_800);
  local_938 = sv("0x4BP1",6);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_928,local_938,&local_960);
  local_8c8 = ::wasm::WATParser::Lexer::takeF64();
  local_970[0] = 150.0;
  local_8d0 = extraout_XMM0_Qa_04;
  testing::internal::EqHelper::Compare<std::optional<double>,_double,_nullptr>
            ((EqHelper *)local_8c0,"Lexer(\"0x4BP1\"sv).takeF64()","0x4BP1",
             (optional<double> *)&local_8d0,local_970);
  ::wasm::WATParser::Lexer::~Lexer(&local_928);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_960);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8c0);
  if (!bVar1) {
    testing::Message::Message(&local_978);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_8c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_12.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x255,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_12.message_,&local_978);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_12.message_);
    testing::Message::~Message(&local_978);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_8c0);
  local_a00 = sv("0x4Bp+2",7);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_9f0,local_a00,&local_a28);
  local_998 = (_Optional_payload_base<float>)::wasm::WATParser::Lexer::takeF32();
  local_a30[0] = 300.0;
  testing::internal::EqHelper::Compare<std::optional<float>,_float,_nullptr>
            ((EqHelper *)local_990,"Lexer(\"0x4Bp+2\"sv).takeF32()","0x4Bp+2f",
             (optional<float> *)&local_998,local_a30);
  ::wasm::WATParser::Lexer::~Lexer(&local_9f0);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_a28);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_990);
  if (!bVar1) {
    testing::Message::Message(&local_a38);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_990);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,599,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13.message_,&local_a38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13.message_);
    testing::Message::~Message(&local_a38);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_990);
  local_ac8 = sv("0x4Bp+2",7);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_ab8,local_ac8,&local_af0);
  local_a58 = ::wasm::WATParser::Lexer::takeF64();
  local_b00[0] = 300.0;
  local_a60 = extraout_XMM0_Qa_05;
  testing::internal::EqHelper::Compare<std::optional<double>,_double,_nullptr>
            ((EqHelper *)local_a50,"Lexer(\"0x4Bp+2\"sv).takeF64()","0x4Bp+2",
             (optional<double> *)&local_a60,local_b00);
  ::wasm::WATParser::Lexer::~Lexer(&local_ab8);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_af0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a50);
  if (!bVar1) {
    testing::Message::Message(&local_b08);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a50);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_14.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,600,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_14.message_,&local_b08);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14.message_);
    testing::Message::~Message(&local_b08);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a50);
  local_b90 = sv("0x4B.P-02",9);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_b80,local_b90,&local_bb8);
  local_b28 = (_Optional_payload_base<float>)::wasm::WATParser::Lexer::takeF32();
  local_bc0[0] = 18.75;
  testing::internal::EqHelper::Compare<std::optional<float>,_float,_nullptr>
            ((EqHelper *)local_b20,"Lexer(\"0x4B.P-02\"sv).takeF32()","0x4B.P-02f",
             (optional<float> *)&local_b28,local_bc0);
  ::wasm::WATParser::Lexer::~Lexer(&local_b80);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_bb8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b20);
  if (!bVar1) {
    testing::Message::Message(&local_bc8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_15.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x25a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_15.message_,&local_bc8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15.message_);
    testing::Message::~Message(&local_bc8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b20);
  local_c58 = sv("0x4B.P-02",9);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_c48,local_c58,&local_c80);
  local_be8 = ::wasm::WATParser::Lexer::takeF64();
  local_c90[0] = 18.75;
  local_bf0 = extraout_XMM0_Qa_06;
  testing::internal::EqHelper::Compare<std::optional<double>,_double,_nullptr>
            ((EqHelper *)local_be0,"Lexer(\"0x4B.P-02\"sv).takeF64()","0x4B.P-02",
             (optional<double> *)&local_bf0,local_c90);
  ::wasm::WATParser::Lexer::~Lexer(&local_c48);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_c80);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_be0);
  if (!bVar1) {
    testing::Message::Message(&local_c98);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_be0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_16.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x25b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_16.message_,&local_c98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_16.message_);
    testing::Message::~Message(&local_c98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_be0);
  local_d20 = sv("0x4B.0p0",8);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_d10,local_d20,&local_d48);
  local_cb8 = (_Optional_payload_base<float>)::wasm::WATParser::Lexer::takeF32();
  local_d50[0] = 75.0;
  testing::internal::EqHelper::Compare<std::optional<float>,_float,_nullptr>
            ((EqHelper *)local_cb0,"Lexer(\"0x4B.0p0\"sv).takeF32()","0x4B.0p0f",
             (optional<float> *)&local_cb8,local_d50);
  ::wasm::WATParser::Lexer::~Lexer(&local_d10);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_d48);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_cb0);
  if (!bVar1) {
    testing::Message::Message(&local_d58);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_cb0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_17.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x25d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_17.message_,&local_d58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17.message_);
    testing::Message::~Message(&local_d58);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_cb0);
  local_de8 = sv("0x4B.0p0",8);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_dd8,local_de8,&local_e10);
  local_d78 = ::wasm::WATParser::Lexer::takeF64();
  local_e20[0] = 75.0;
  local_d80 = extraout_XMM0_Qa_07;
  testing::internal::EqHelper::Compare<std::optional<double>,_double,_nullptr>
            ((EqHelper *)local_d70,"Lexer(\"0x4B.0p0\"sv).takeF64()","0x4B.0p0",
             (optional<double> *)&local_d80,local_e20);
  ::wasm::WATParser::Lexer::~Lexer(&local_dd8);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_e10);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d70);
  if (!bVar1) {
    testing::Message::Message(&local_e28);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_d70);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_18.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x25e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_18.message_,&local_e28);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_18.message_);
    testing::Message::~Message(&local_e28);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d70);
  local_eb0 = sv("0x4B.0P1",8);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_ea0,local_eb0,&local_ed8);
  local_e48 = (_Optional_payload_base<float>)::wasm::WATParser::Lexer::takeF32();
  local_ee0[0] = 150.0;
  testing::internal::EqHelper::Compare<std::optional<float>,_float,_nullptr>
            ((EqHelper *)local_e40,"Lexer(\"0x4B.0P1\"sv).takeF32()","0x4B.0P1f",
             (optional<float> *)&local_e48,local_ee0);
  ::wasm::WATParser::Lexer::~Lexer(&local_ea0);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_ed8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e40);
  if (!bVar1) {
    testing::Message::Message(&local_ee8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_e40);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_19.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x260,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_19.message_,&local_ee8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_19.message_);
    testing::Message::~Message(&local_ee8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e40);
  local_f78 = sv("0x4B.0P1",8);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_f68,local_f78,&local_fa0);
  local_f08 = ::wasm::WATParser::Lexer::takeF64();
  local_fb0[0] = 150.0;
  local_f10 = extraout_XMM0_Qa_08;
  testing::internal::EqHelper::Compare<std::optional<double>,_double,_nullptr>
            ((EqHelper *)local_f00,"Lexer(\"0x4B.0P1\"sv).takeF64()","0x4B.0P1",
             (optional<double> *)&local_f10,local_fb0);
  ::wasm::WATParser::Lexer::~Lexer(&local_f68);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_fa0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f00);
  if (!bVar1) {
    testing::Message::Message(&local_fb8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_f00);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_20.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x261,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_20.message_,&local_fb8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_20.message_);
    testing::Message::~Message(&local_fb8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f00);
  local_1040 = sv("0x4B.0p+2",9);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_1030,local_1040,&local_1068);
  local_fd8 = (_Optional_payload_base<float>)::wasm::WATParser::Lexer::takeF32();
  local_1070[0] = 300.0;
  testing::internal::EqHelper::Compare<std::optional<float>,_float,_nullptr>
            ((EqHelper *)local_fd0,"Lexer(\"0x4B.0p+2\"sv).takeF32()","0x4B.0p+2f",
             (optional<float> *)&local_fd8,local_1070);
  ::wasm::WATParser::Lexer::~Lexer(&local_1030);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_1068);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_fd0);
  if (!bVar1) {
    testing::Message::Message(&local_1078);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_fd0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_21.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x263,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_21.message_,&local_1078);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_21.message_);
    testing::Message::~Message(&local_1078);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_fd0);
  local_1108 = sv("0x4B.0p+2",9);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_10f8,local_1108,&local_1130);
  local_1098 = ::wasm::WATParser::Lexer::takeF64();
  local_1140[0] = 300.0;
  local_10a0 = extraout_XMM0_Qa_09;
  testing::internal::EqHelper::Compare<std::optional<double>,_double,_nullptr>
            ((EqHelper *)local_1090,"Lexer(\"0x4B.0p+2\"sv).takeF64()","0x4B.0p+2",
             (optional<double> *)&local_10a0,local_1140);
  ::wasm::WATParser::Lexer::~Lexer(&local_10f8);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_1130);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1090);
  if (!bVar1) {
    testing::Message::Message(&local_1148);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1090);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_22.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x264,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_22.message_,&local_1148);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_22.message_);
    testing::Message::~Message(&local_1148);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1090);
  local_11d0 = sv("0x4B.0P-2",9);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_11c0,local_11d0,&local_11f8);
  local_1168 = (_Optional_payload_base<float>)::wasm::WATParser::Lexer::takeF32();
  local_1200[0] = 18.75;
  testing::internal::EqHelper::Compare<std::optional<float>,_float,_nullptr>
            ((EqHelper *)local_1160,"Lexer(\"0x4B.0P-2\"sv).takeF32()","0x4B.0P-2f",
             (optional<float> *)&local_1168,local_1200);
  ::wasm::WATParser::Lexer::~Lexer(&local_11c0);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_11f8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1160);
  if (!bVar1) {
    testing::Message::Message(&local_1208);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1160);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_23.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x266,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_23.message_,&local_1208);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_23.message_);
    testing::Message::~Message(&local_1208);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1160);
  local_1298 = sv("0x4B.0P-2",9);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_1288,local_1298,&local_12c0);
  local_1228 = ::wasm::WATParser::Lexer::takeF64();
  local_12d0[0] = 18.75;
  local_1230 = extraout_XMM0_Qa_10;
  testing::internal::EqHelper::Compare<std::optional<double>,_double,_nullptr>
            ((EqHelper *)local_1220,"Lexer(\"0x4B.0P-2\"sv).takeF64()","0x4B.0P-2",
             (optional<double> *)&local_1230,local_12d0);
  ::wasm::WATParser::Lexer::~Lexer(&local_1288);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_12c0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1220);
  if (!bVar1) {
    testing::Message::Message(&local_12d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1220);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_24.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x267,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_24.message_,&local_12d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_24.message_);
    testing::Message::~Message(&local_12d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1220);
  local_1360 = sv("+0x4B.0p+2",10);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_1350,local_1360,&local_1388);
  local_12f8 = (_Optional_payload_base<float>)::wasm::WATParser::Lexer::takeF32();
  local_1390[0] = 300.0;
  testing::internal::EqHelper::Compare<std::optional<float>,_float,_nullptr>
            ((EqHelper *)local_12f0,"Lexer(\"+0x4B.0p+2\"sv).takeF32()","+0x4B.0p+2f",
             (optional<float> *)&local_12f8,local_1390);
  ::wasm::WATParser::Lexer::~Lexer(&local_1350);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_1388);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_12f0);
  if (!bVar1) {
    testing::Message::Message(&local_1398);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_12f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_25.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x269,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_25.message_,&local_1398);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_25.message_);
    testing::Message::~Message(&local_1398);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_12f0);
  local_1428 = sv("+0x4B.0p+2",10);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_1418,local_1428,&local_1450);
  local_13b8 = ::wasm::WATParser::Lexer::takeF64();
  local_1460[0] = 300.0;
  local_13c0 = extraout_XMM0_Qa_11;
  testing::internal::EqHelper::Compare<std::optional<double>,_double,_nullptr>
            ((EqHelper *)local_13b0,"Lexer(\"+0x4B.0p+2\"sv).takeF64()","+0x4B.0p+2",
             (optional<double> *)&local_13c0,local_1460);
  ::wasm::WATParser::Lexer::~Lexer(&local_1418);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_1450);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_13b0);
  if (!bVar1) {
    testing::Message::Message(&local_1468);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_13b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_26.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x26a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_26.message_,&local_1468);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_26.message_);
    testing::Message::~Message(&local_1468);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_13b0);
  local_14f0 = sv("-0x4B.0p+2",10);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_14e0,local_14f0,&local_1518);
  local_1488 = (_Optional_payload_base<float>)::wasm::WATParser::Lexer::takeF32();
  local_1520[0] = -300.0;
  testing::internal::EqHelper::Compare<std::optional<float>,_float,_nullptr>
            ((EqHelper *)local_1480,"Lexer(\"-0x4B.0p+2\"sv).takeF32()","-0x4B.0p+2f",
             (optional<float> *)&local_1488,local_1520);
  ::wasm::WATParser::Lexer::~Lexer(&local_14e0);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_1518);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1480);
  if (!bVar1) {
    testing::Message::Message(&local_1528);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1480);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_27.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x26c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_27.message_,&local_1528);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_27.message_);
    testing::Message::~Message(&local_1528);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1480);
  local_15b8 = sv("-0x4B.0p+2",10);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_15a8,local_15b8,&local_15e0);
  local_1548 = ::wasm::WATParser::Lexer::takeF64();
  local_15f0[0] = -300.0;
  local_1550 = extraout_XMM0_Qa_12;
  testing::internal::EqHelper::Compare<std::optional<double>,_double,_nullptr>
            ((EqHelper *)local_1540,"Lexer(\"-0x4B.0p+2\"sv).takeF64()","-0x4B.0p+2",
             (optional<double> *)&local_1550,local_15f0);
  ::wasm::WATParser::Lexer::~Lexer(&local_15a8);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_15e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1540);
  if (!bVar1) {
    testing::Message::Message(&local_15f8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1540);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_28.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x26d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_28.message_,&local_15f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_28.message_);
    testing::Message::~Message(&local_15f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1540);
  local_1680 = sv("0x4_2.0_0p+0_2",0xe);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_1670,local_1680,&local_16a8);
  local_1618 = (_Optional_payload_base<float>)::wasm::WATParser::Lexer::takeF32();
  local_16b0[0] = 264.0;
  testing::internal::EqHelper::Compare<std::optional<float>,_float,_nullptr>
            ((EqHelper *)local_1610,"Lexer(\"0x4_2.0_0p+0_2\"sv).takeF32()","0x42.00p+02f",
             (optional<float> *)&local_1618,local_16b0);
  ::wasm::WATParser::Lexer::~Lexer(&local_1670);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_16a8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1610);
  if (!bVar1) {
    testing::Message::Message(&local_16b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1610);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_29.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x26f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_29.message_,&local_16b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_29.message_);
    testing::Message::~Message(&local_16b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1610);
  local_1748 = sv("0x4_2.0_0p+0_2",0xe);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_1738,local_1748,&local_1770);
  local_16d8 = ::wasm::WATParser::Lexer::takeF64();
  local_1780[0] = 264.0;
  local_16e0 = extraout_XMM0_Qa_13;
  testing::internal::EqHelper::Compare<std::optional<double>,_double,_nullptr>
            ((EqHelper *)local_16d0,"Lexer(\"0x4_2.0_0p+0_2\"sv).takeF64()","0x42.00p+02",
             (optional<double> *)&local_16e0,local_1780);
  ::wasm::WATParser::Lexer::~Lexer(&local_1738);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_1770);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_16d0);
  if (!bVar1) {
    testing::Message::Message(&local_1788);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_16d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x270,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_1788);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(&local_1788);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_16d0);
  local_1818 = sv("0x4Bjunk",8);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_1808,local_1818,&local_1840);
  local_17ac = ::wasm::WATParser::Lexer::takeF32();
  local_17a1 = std::optional::operator_cast_to_bool((optional *)&local_17ac);
  local_17a1 = !local_17a1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_17a0,&local_17a1,(type *)0x0);
  ::wasm::WATParser::Lexer::~Lexer(&local_1808);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_1840);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_17a0);
  if (!bVar1) {
    testing::Message::Message(local_1850);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_17a0,
               (AssertionResult *)"Lexer(\"0x4Bjunk\"sv).takeF32()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1858,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x272,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1858,local_1850);
    testing::internal::AssertHelper::~AssertHelper(&local_1858);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(local_1850);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_17a0);
  local_1908 = sv("0x4Bjunk",8);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_18f8,local_1908,&local_1930);
  local_1898 = ::wasm::WATParser::Lexer::takeF64();
  local_18a0 = extraout_XMM0_Qa_14;
  local_1889 = std::optional::operator_cast_to_bool((optional *)&local_18a0);
  local_1889 = !local_1889;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1888,&local_1889,(type *)0x0);
  ::wasm::WATParser::Lexer::~Lexer(&local_18f8);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_1930);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1888);
  if (!bVar1) {
    testing::Message::Message(local_1940);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__2.message_,(internal *)local_1888,
               (AssertionResult *)"Lexer(\"0x4Bjunk\"sv).takeF64()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1948,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x273,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1948,local_1940);
    testing::internal::AssertHelper::~AssertHelper(&local_1948);
    std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
    testing::Message::~Message(local_1940);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1888);
  local_19f0 = sv("0x4B.junk",9);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_19e0,local_19f0,&local_1a18);
  local_1984 = ::wasm::WATParser::Lexer::takeF32();
  local_1979 = std::optional::operator_cast_to_bool((optional *)&local_1984);
  local_1979 = !local_1979;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1978,&local_1979,(type *)0x0);
  ::wasm::WATParser::Lexer::~Lexer(&local_19e0);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_1a18);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1978);
  if (!bVar1) {
    testing::Message::Message(local_1a28);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__3.message_,(internal *)local_1978,
               (AssertionResult *)"Lexer(\"0x4B.junk\"sv).takeF32()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1a30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x275,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1a30,local_1a28);
    testing::internal::AssertHelper::~AssertHelper(&local_1a30);
    std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
    testing::Message::~Message(local_1a28);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1978);
  local_1ae0 = sv("0x4B.junk",9);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_1ad0,local_1ae0,&local_1b08);
  local_1a70 = ::wasm::WATParser::Lexer::takeF64();
  local_1a78 = extraout_XMM0_Qa_15;
  local_1a61 = std::optional::operator_cast_to_bool((optional *)&local_1a78);
  local_1a61 = !local_1a61;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1a60,&local_1a61,(type *)0x0);
  ::wasm::WATParser::Lexer::~Lexer(&local_1ad0);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_1b08);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a60);
  if (!bVar1) {
    testing::Message::Message(local_1b18);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__4.message_,(internal *)local_1a60,
               (AssertionResult *)"Lexer(\"0x4B.junk\"sv).takeF64()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1b20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x276,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1b20,local_1b18);
    testing::internal::AssertHelper::~AssertHelper(&local_1b20);
    std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
    testing::Message::~Message(local_1b18);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a60);
  local_1bc8 = sv("0x4B.0junk",10);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_1bb8,local_1bc8,&local_1bf0);
  local_1b5c = ::wasm::WATParser::Lexer::takeF32();
  local_1b51 = std::optional::operator_cast_to_bool((optional *)&local_1b5c);
  local_1b51 = !local_1b51;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1b50,&local_1b51,(type *)0x0);
  ::wasm::WATParser::Lexer::~Lexer(&local_1bb8);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_1bf0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b50);
  if (!bVar1) {
    testing::Message::Message(local_1c00);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__5.message_,(internal *)local_1b50,
               (AssertionResult *)"Lexer(\"0x4B.0junk\"sv).takeF32()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1c08,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x278,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1c08,local_1c00);
    testing::internal::AssertHelper::~AssertHelper(&local_1c08);
    std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
    testing::Message::~Message(local_1c00);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b50);
  local_1cb8 = sv("0x4B.0junk",10);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_1ca8,local_1cb8,&local_1ce0);
  local_1c48 = ::wasm::WATParser::Lexer::takeF64();
  local_1c50 = extraout_XMM0_Qa_16;
  local_1c39 = std::optional::operator_cast_to_bool((optional *)&local_1c50);
  local_1c39 = !local_1c39;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1c38,&local_1c39,(type *)0x0);
  ::wasm::WATParser::Lexer::~Lexer(&local_1ca8);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_1ce0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c38);
  if (!bVar1) {
    testing::Message::Message(local_1cf0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__6.message_,(internal *)local_1c38,
               (AssertionResult *)"Lexer(\"0x4B.0junk\"sv).takeF64()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1cf8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x279,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1cf8,local_1cf0);
    testing::internal::AssertHelper::~AssertHelper(&local_1cf8);
    std::__cxx11::string::~string((string *)&gtest_ar__6.message_);
    testing::Message::~Message(local_1cf0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c38);
  local_1da0 = sv("0x4B.Pjunk",10);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_1d90,local_1da0,&local_1dc8);
  local_1d34 = ::wasm::WATParser::Lexer::takeF32();
  local_1d29 = std::optional::operator_cast_to_bool((optional *)&local_1d34);
  local_1d29 = !local_1d29;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1d28,&local_1d29,(type *)0x0);
  ::wasm::WATParser::Lexer::~Lexer(&local_1d90);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_1dc8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d28);
  if (!bVar1) {
    testing::Message::Message(local_1dd8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__7.message_,(internal *)local_1d28,
               (AssertionResult *)"Lexer(\"0x4B.Pjunk\"sv).takeF32()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1de0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x27b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1de0,local_1dd8);
    testing::internal::AssertHelper::~AssertHelper(&local_1de0);
    std::__cxx11::string::~string((string *)&gtest_ar__7.message_);
    testing::Message::~Message(local_1dd8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d28);
  local_1e90 = sv("0x4B.Pjunk",10);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_1e80,local_1e90,&local_1eb8);
  local_1e20 = ::wasm::WATParser::Lexer::takeF64();
  local_1e28 = extraout_XMM0_Qa_17;
  local_1e11 = std::optional::operator_cast_to_bool((optional *)&local_1e28);
  local_1e11 = !local_1e11;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1e10,&local_1e11,(type *)0x0);
  ::wasm::WATParser::Lexer::~Lexer(&local_1e80);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_1eb8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e10);
  if (!bVar1) {
    testing::Message::Message(local_1ec8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__8.message_,(internal *)local_1e10,
               (AssertionResult *)"Lexer(\"0x4B.Pjunk\"sv).takeF64()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1ed0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x27c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1ed0,local_1ec8);
    testing::internal::AssertHelper::~AssertHelper(&local_1ed0);
    std::__cxx11::string::~string((string *)&gtest_ar__8.message_);
    testing::Message::~Message(local_1ec8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e10);
  local_1f78 = sv("0x4B.p-junk",0xb);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_1f68,local_1f78,&local_1fa0);
  local_1f0c = ::wasm::WATParser::Lexer::takeF32();
  local_1f01 = std::optional::operator_cast_to_bool((optional *)&local_1f0c);
  local_1f01 = !local_1f01;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1f00,&local_1f01,(type *)0x0);
  ::wasm::WATParser::Lexer::~Lexer(&local_1f68);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_1fa0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f00);
  if (!bVar1) {
    testing::Message::Message(local_1fb0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__9.message_,(internal *)local_1f00,
               (AssertionResult *)"Lexer(\"0x4B.p-junk\"sv).takeF32()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1fb8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x27e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1fb8,local_1fb0);
    testing::internal::AssertHelper::~AssertHelper(&local_1fb8);
    std::__cxx11::string::~string((string *)&gtest_ar__9.message_);
    testing::Message::~Message(local_1fb0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f00);
  local_2068 = sv("0x4B.p-junk",0xb);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_2058,local_2068,&local_2090);
  local_1ff8 = ::wasm::WATParser::Lexer::takeF64();
  local_2000 = extraout_XMM0_Qa_18;
  local_1fe9 = std::optional::operator_cast_to_bool((optional *)&local_2000);
  local_1fe9 = !local_1fe9;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1fe8,&local_1fe9,(type *)0x0);
  ::wasm::WATParser::Lexer::~Lexer(&local_2058);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_2090);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1fe8);
  if (!bVar1) {
    testing::Message::Message(local_20a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__10.message_,(internal *)local_1fe8,
               (AssertionResult *)"Lexer(\"0x4B.p-junk\"sv).takeF64()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_20a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x27f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_20a8,local_20a0);
    testing::internal::AssertHelper::~AssertHelper(&local_20a8);
    std::__cxx11::string::~string((string *)&gtest_ar__10.message_);
    testing::Message::~Message(local_20a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1fe8);
  local_2150 = sv("0x4B.p-10junk",0xd);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_2140,local_2150,&local_2178);
  local_20e4 = ::wasm::WATParser::Lexer::takeF32();
  local_20d9 = std::optional::operator_cast_to_bool((optional *)&local_20e4);
  local_20d9 = !local_20d9;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_20d8,&local_20d9,(type *)0x0);
  ::wasm::WATParser::Lexer::~Lexer(&local_2140);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_2178);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20d8);
  if (!bVar1) {
    testing::Message::Message(local_2188);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__11.message_,(internal *)local_20d8,
               (AssertionResult *)"Lexer(\"0x4B.p-10junk\"sv).takeF32()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2190,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x281,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2190,local_2188);
    testing::internal::AssertHelper::~AssertHelper(&local_2190);
    std::__cxx11::string::~string((string *)&gtest_ar__11.message_);
    testing::Message::~Message(local_2188);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20d8);
  local_2240 = sv("0x4B.p-10junk",0xd);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_2230,local_2240,&local_2268);
  local_21d0 = ::wasm::WATParser::Lexer::takeF64();
  local_21d8 = extraout_XMM0_Qa_19;
  local_21c1 = std::optional::operator_cast_to_bool((optional *)&local_21d8);
  local_21c1 = !local_21c1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_21c0,&local_21c1,(type *)0x0);
  ::wasm::WATParser::Lexer::~Lexer(&local_2230);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_2268);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_21c0);
  if (!bVar1) {
    testing::Message::Message(local_2278);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__12.message_,(internal *)local_21c0,
               (AssertionResult *)"Lexer(\"0x4B.p-10junk\"sv).takeF64()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2280,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x282,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2280,local_2278);
    testing::internal::AssertHelper::~AssertHelper(&local_2280);
    std::__cxx11::string::~string((string *)&gtest_ar__12.message_);
    testing::Message::~Message(local_2278);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_21c0);
  local_2328 = sv("+0x",3);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_2318,local_2328,&local_2350);
  local_22bc = ::wasm::WATParser::Lexer::takeF32();
  local_22b1 = std::optional::operator_cast_to_bool((optional *)&local_22bc);
  local_22b1 = !local_22b1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_22b0,&local_22b1,(type *)0x0);
  ::wasm::WATParser::Lexer::~Lexer(&local_2318);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_2350);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_22b0);
  if (!bVar1) {
    testing::Message::Message(local_2360);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__13.message_,(internal *)local_22b0,
               (AssertionResult *)"Lexer(\"+0x\"sv).takeF32()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2368,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x284,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2368,local_2360);
    testing::internal::AssertHelper::~AssertHelper(&local_2368);
    std::__cxx11::string::~string((string *)&gtest_ar__13.message_);
    testing::Message::~Message(local_2360);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_22b0);
  local_2418 = sv("+0x",3);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_2408,local_2418,&local_2440);
  local_23a8 = ::wasm::WATParser::Lexer::takeF64();
  local_23b0 = extraout_XMM0_Qa_20;
  local_2399 = std::optional::operator_cast_to_bool((optional *)&local_23b0);
  local_2399 = !local_2399;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2398,&local_2399,(type *)0x0);
  ::wasm::WATParser::Lexer::~Lexer(&local_2408);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_2440);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2398);
  if (!bVar1) {
    testing::Message::Message(local_2450);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__14.message_,(internal *)local_2398,
               (AssertionResult *)"Lexer(\"+0x\"sv).takeF64()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2458,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x285,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2458,local_2450);
    testing::internal::AssertHelper::~AssertHelper(&local_2458);
    std::__cxx11::string::~string((string *)&gtest_ar__14.message_);
    testing::Message::~Message(local_2450);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2398);
  local_2500 = sv("0x4Bp",5);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_24f0,local_2500,&local_2528);
  local_2494 = ::wasm::WATParser::Lexer::takeF32();
  local_2489 = std::optional::operator_cast_to_bool((optional *)&local_2494);
  local_2489 = !local_2489;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2488,&local_2489,(type *)0x0);
  ::wasm::WATParser::Lexer::~Lexer(&local_24f0);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_2528);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2488);
  if (!bVar1) {
    testing::Message::Message(local_2538);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__15.message_,(internal *)local_2488,
               (AssertionResult *)"Lexer(\"0x4Bp\"sv).takeF32()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2540,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x287,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2540,local_2538);
    testing::internal::AssertHelper::~AssertHelper(&local_2540);
    std::__cxx11::string::~string((string *)&gtest_ar__15.message_);
    testing::Message::~Message(local_2538);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2488);
  local_25f0 = sv("0x4Bp",5);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_25e0,local_25f0,&local_2618);
  local_2580 = ::wasm::WATParser::Lexer::takeF64();
  local_2588 = extraout_XMM0_Qa_21;
  local_2571 = std::optional::operator_cast_to_bool((optional *)&local_2588);
  local_2571 = !local_2571;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2570,&local_2571,(type *)0x0);
  ::wasm::WATParser::Lexer::~Lexer(&local_25e0);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_2618);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2570);
  if (!bVar1) {
    testing::Message::Message(local_2628);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__16.message_,(internal *)local_2570,
               (AssertionResult *)"Lexer(\"0x4Bp\"sv).takeF64()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2630,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x288,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2630,local_2628);
    testing::internal::AssertHelper::~AssertHelper(&local_2630);
    std::__cxx11::string::~string((string *)&gtest_ar__16.message_);
    testing::Message::~Message(local_2628);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2570);
  local_26d8 = sv("0x4BpABC",8);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_26c8,local_26d8,&local_2700);
  local_266c = ::wasm::WATParser::Lexer::takeF32();
  local_2661 = std::optional::operator_cast_to_bool((optional *)&local_266c);
  local_2661 = !local_2661;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2660,&local_2661,(type *)0x0);
  ::wasm::WATParser::Lexer::~Lexer(&local_26c8);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_2700);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2660);
  if (!bVar1) {
    testing::Message::Message(local_2710);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__17.message_,(internal *)local_2660,
               (AssertionResult *)"Lexer(\"0x4BpABC\"sv).takeF32()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2718,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x28a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2718,local_2710);
    testing::internal::AssertHelper::~AssertHelper(&local_2718);
    std::__cxx11::string::~string((string *)&gtest_ar__17.message_);
    testing::Message::~Message(local_2710);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2660);
  local_27c8 = sv("0x4BpABC",8);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_27b8,local_27c8,&local_27f0);
  local_2758 = ::wasm::WATParser::Lexer::takeF64();
  local_2760 = extraout_XMM0_Qa_22;
  local_2749 = std::optional::operator_cast_to_bool((optional *)&local_2760);
  local_2749 = !local_2749;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2748,&local_2749,(type *)0x0);
  ::wasm::WATParser::Lexer::~Lexer(&local_27b8);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_27f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2748);
  if (!bVar1) {
    testing::Message::Message(local_2800);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__18.message_,(internal *)local_2748,
               (AssertionResult *)"Lexer(\"0x4BpABC\"sv).takeF64()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2808,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x28b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2808,local_2800);
    testing::internal::AssertHelper::~AssertHelper(&local_2808);
    std::__cxx11::string::~string((string *)&gtest_ar__18.message_);
    testing::Message::~Message(local_2800);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2748);
  local_28b0 = sv("0x4Bp0xABC",10);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_28a0,local_28b0,&local_28d8);
  local_2844 = ::wasm::WATParser::Lexer::takeF32();
  local_2839 = std::optional::operator_cast_to_bool((optional *)&local_2844);
  local_2839 = !local_2839;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2838,&local_2839,(type *)0x0);
  ::wasm::WATParser::Lexer::~Lexer(&local_28a0);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_28d8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2838);
  if (!bVar1) {
    testing::Message::Message(local_28e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__19.message_,(internal *)local_2838,
               (AssertionResult *)"Lexer(\"0x4Bp0xABC\"sv).takeF32()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_28f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x28d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_28f0,local_28e8);
    testing::internal::AssertHelper::~AssertHelper(&local_28f0);
    std::__cxx11::string::~string((string *)&gtest_ar__19.message_);
    testing::Message::~Message(local_28e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2838);
  local_29a0 = sv("0x4Bp0xABC",10);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_2990,local_29a0,&local_29c8);
  local_2930 = ::wasm::WATParser::Lexer::takeF64();
  local_2938 = extraout_XMM0_Qa_23;
  local_2921 = std::optional::operator_cast_to_bool((optional *)&local_2938);
  local_2921 = !local_2921;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2920,&local_2921,(type *)0x0);
  ::wasm::WATParser::Lexer::~Lexer(&local_2990);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_29c8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2920);
  if (!bVar1) {
    testing::Message::Message(local_29d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__20.message_,(internal *)local_2920,
               (AssertionResult *)"Lexer(\"0x4Bp0xABC\"sv).takeF64()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_29e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x28e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_29e0,local_29d8);
    testing::internal::AssertHelper::~AssertHelper(&local_29e0);
    std::__cxx11::string::~string((string *)&gtest_ar__20.message_);
    testing::Message::~Message(local_29d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2920);
  local_2a88 = sv("0x+0",4);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_2a78,local_2a88,&local_2ab0);
  local_2a1c = ::wasm::WATParser::Lexer::takeF32();
  local_2a11 = std::optional::operator_cast_to_bool((optional *)&local_2a1c);
  local_2a11 = !local_2a11;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2a10,&local_2a11,(type *)0x0);
  ::wasm::WATParser::Lexer::~Lexer(&local_2a78);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_2ab0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2a10);
  if (!bVar1) {
    testing::Message::Message(local_2ac0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__21.message_,(internal *)local_2a10,
               (AssertionResult *)"Lexer(\"0x+0\"sv).takeF32()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2ac8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x290,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2ac8,local_2ac0);
    testing::internal::AssertHelper::~AssertHelper(&local_2ac8);
    std::__cxx11::string::~string((string *)&gtest_ar__21.message_);
    testing::Message::~Message(local_2ac0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2a10);
  local_2b78 = sv("0x+0",4);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_2b68,local_2b78,&local_2ba0);
  local_2b08 = ::wasm::WATParser::Lexer::takeF64();
  local_2b10 = extraout_XMM0_Qa_24;
  local_2af9 = std::optional::operator_cast_to_bool((optional *)&local_2b10);
  local_2af9 = !local_2af9;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2af8,&local_2af9,(type *)0x0);
  ::wasm::WATParser::Lexer::~Lexer(&local_2b68);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_2ba0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2af8);
  if (!bVar1) {
    testing::Message::Message(local_2bb0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__22.message_,(internal *)local_2af8,
               (AssertionResult *)"Lexer(\"0x+0\"sv).takeF64()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2bb8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x291,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2bb8,local_2bb0);
    testing::internal::AssertHelper::~AssertHelper(&local_2bb8);
    std::__cxx11::string::~string((string *)&gtest_ar__22.message_);
    testing::Message::~Message(local_2bb0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2af8);
  local_2c60 = sv("+-0x4B",6);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_2c50,local_2c60,&local_2c88);
  local_2bf4 = ::wasm::WATParser::Lexer::takeF32();
  local_2be9 = std::optional::operator_cast_to_bool((optional *)&local_2bf4);
  local_2be9 = !local_2be9;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2be8,&local_2be9,(type *)0x0);
  ::wasm::WATParser::Lexer::~Lexer(&local_2c50);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_2c88);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2be8);
  if (!bVar1) {
    testing::Message::Message(local_2c98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__23.message_,(internal *)local_2be8,
               (AssertionResult *)"Lexer(\"+-0x4B\"sv).takeF32()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2ca0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x293,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2ca0,local_2c98);
    testing::internal::AssertHelper::~AssertHelper(&local_2ca0);
    std::__cxx11::string::~string((string *)&gtest_ar__23.message_);
    testing::Message::~Message(local_2c98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2be8);
  local_2d50 = sv("+-0x4B",6);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_2d40,local_2d50,&local_2d78);
  local_2ce0 = ::wasm::WATParser::Lexer::takeF64();
  local_2ce8 = extraout_XMM0_Qa_25;
  local_2cd1 = std::optional::operator_cast_to_bool((optional *)&local_2ce8);
  local_2cd1 = !local_2cd1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2cd0,&local_2cd1,(type *)0x0);
  ::wasm::WATParser::Lexer::~Lexer(&local_2d40);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_2d78);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2cd0);
  if (!bVar1) {
    testing::Message::Message(local_2d88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__24.message_,(internal *)local_2cd0,
               (AssertionResult *)"Lexer(\"+-0x4B\"sv).takeF64()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2d90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x294,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2d90,local_2d88);
    testing::internal::AssertHelper::~AssertHelper(&local_2d90);
    std::__cxx11::string::~string((string *)&gtest_ar__24.message_);
    testing::Message::~Message(local_2d88);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2cd0);
  local_2e38 = sv("-+0x4B",6);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_2e28,local_2e38,&local_2e60);
  local_2dcc = ::wasm::WATParser::Lexer::takeF32();
  local_2dc1 = std::optional::operator_cast_to_bool((optional *)&local_2dcc);
  local_2dc1 = !local_2dc1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2dc0,&local_2dc1,(type *)0x0);
  ::wasm::WATParser::Lexer::~Lexer(&local_2e28);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_2e60);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2dc0);
  if (!bVar1) {
    testing::Message::Message(local_2e70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__25.message_,(internal *)local_2dc0,
               (AssertionResult *)"Lexer(\"-+0x4B\"sv).takeF32()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2e78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x296,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2e78,local_2e70);
    testing::internal::AssertHelper::~AssertHelper(&local_2e78);
    std::__cxx11::string::~string((string *)&gtest_ar__25.message_);
    testing::Message::~Message(local_2e70);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2dc0);
  local_2f28 = sv("-+0x4B",6);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_2f18,local_2f28,&local_2f50);
  local_2eb8 = ::wasm::WATParser::Lexer::takeF64();
  local_2ec0 = extraout_XMM0_Qa_26;
  local_2ea9 = std::optional::operator_cast_to_bool((optional *)&local_2ec0);
  local_2ea9 = !local_2ea9;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2ea8,&local_2ea9,(type *)0x0);
  ::wasm::WATParser::Lexer::~Lexer(&local_2f18);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_2f50);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2ea8);
  if (!bVar1) {
    testing::Message::Message(local_2f60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__26.message_,(internal *)local_2ea8,
               (AssertionResult *)"Lexer(\"-+0x4B\"sv).takeF64()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2f68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x297,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2f68,local_2f60);
    testing::internal::AssertHelper::~AssertHelper(&local_2f68);
    std::__cxx11::string::~string((string *)&gtest_ar__26.message_);
    testing::Message::~Message(local_2f60);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2ea8);
  local_3010 = sv("0x4Bp+-0",8);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_3000,local_3010,&local_3038);
  local_2fa4 = ::wasm::WATParser::Lexer::takeF32();
  local_2f99 = std::optional::operator_cast_to_bool((optional *)&local_2fa4);
  local_2f99 = !local_2f99;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2f98,&local_2f99,(type *)0x0);
  ::wasm::WATParser::Lexer::~Lexer(&local_3000);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_3038);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2f98);
  if (!bVar1) {
    testing::Message::Message(local_3048);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__27.message_,(internal *)local_2f98,
               (AssertionResult *)"Lexer(\"0x4Bp+-0\"sv).takeF32()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_3050,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x299,pcVar2);
    testing::internal::AssertHelper::operator=(&local_3050,local_3048);
    testing::internal::AssertHelper::~AssertHelper(&local_3050);
    std::__cxx11::string::~string((string *)&gtest_ar__27.message_);
    testing::Message::~Message(local_3048);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2f98);
  local_3100 = sv("0x4Bp+-0",8);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_30f0,local_3100,&local_3128);
  local_3090 = ::wasm::WATParser::Lexer::takeF64();
  local_3098 = extraout_XMM0_Qa_27;
  local_3081 = std::optional::operator_cast_to_bool((optional *)&local_3098);
  local_3081 = !local_3081;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_3080,&local_3081,(type *)0x0);
  ::wasm::WATParser::Lexer::~Lexer(&local_30f0);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_3128);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3080);
  if (!bVar1) {
    testing::Message::Message(local_3138);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__28.message_,(internal *)local_3080,
               (AssertionResult *)"Lexer(\"0x4Bp+-0\"sv).takeF64()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_3140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x29a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_3140,local_3138);
    testing::internal::AssertHelper::~AssertHelper(&local_3140);
    std::__cxx11::string::~string((string *)&gtest_ar__28.message_);
    testing::Message::~Message(local_3138);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3080);
  local_31e8 = sv("0x4Bp-+0",8);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_31d8,local_31e8,&local_3210);
  local_317c = ::wasm::WATParser::Lexer::takeF32();
  local_3171 = std::optional::operator_cast_to_bool((optional *)&local_317c);
  local_3171 = !local_3171;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_3170,&local_3171,(type *)0x0);
  ::wasm::WATParser::Lexer::~Lexer(&local_31d8);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_3210);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3170);
  if (!bVar1) {
    testing::Message::Message(local_3220);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__29.message_,(internal *)local_3170,
               (AssertionResult *)"Lexer(\"0x4Bp-+0\"sv).takeF32()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_3228,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x29c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_3228,local_3220);
    testing::internal::AssertHelper::~AssertHelper(&local_3228);
    std::__cxx11::string::~string((string *)&gtest_ar__29.message_);
    testing::Message::~Message(local_3220);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3170);
  local_32d8 = sv("0x4Bp-+0",8);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_32c8,local_32d8,&local_3300);
  local_3268 = ::wasm::WATParser::Lexer::takeF64();
  local_3270 = extraout_XMM0_Qa_28;
  local_3259 = std::optional::operator_cast_to_bool((optional *)&local_3270);
  local_3259 = !local_3259;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_3258,&local_3259,(type *)0x0);
  ::wasm::WATParser::Lexer::~Lexer(&local_32c8);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_3300);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3258);
  if (!bVar1) {
    testing::Message::Message(local_3310);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__30.message_,(internal *)local_3258,
               (AssertionResult *)"Lexer(\"0x4Bp-+0\"sv).takeF64()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_3318,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x29d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_3318,local_3310);
    testing::internal::AssertHelper::~AssertHelper(&local_3318);
    std::__cxx11::string::~string((string *)&gtest_ar__30.message_);
    testing::Message::~Message(local_3310);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3258);
  local_33c0 = sv("0x4B.e+0",8);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_33b0,local_33c0,&local_33e8);
  local_3354 = ::wasm::WATParser::Lexer::takeF32();
  local_3349 = std::optional::operator_cast_to_bool((optional *)&local_3354);
  local_3349 = !local_3349;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_3348,&local_3349,(type *)0x0);
  ::wasm::WATParser::Lexer::~Lexer(&local_33b0);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_33e8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3348);
  if (!bVar1) {
    testing::Message::Message(local_33f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__31.message_,(internal *)local_3348,
               (AssertionResult *)"Lexer(\"0x4B.e+0\"sv).takeF32()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_3400,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x29f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_3400,local_33f8);
    testing::internal::AssertHelper::~AssertHelper(&local_3400);
    std::__cxx11::string::~string((string *)&gtest_ar__31.message_);
    testing::Message::~Message(local_33f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3348);
  local_34b0 = sv("0x4B.e+0",8);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_34a0,local_34b0,&local_34d8);
  local_3440 = ::wasm::WATParser::Lexer::takeF64();
  local_3448 = extraout_XMM0_Qa_29;
  local_3431 = std::optional::operator_cast_to_bool((optional *)&local_3448);
  local_3431 = !local_3431;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_3430,&local_3431,(type *)0x0);
  ::wasm::WATParser::Lexer::~Lexer(&local_34a0);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_34d8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3430);
  if (!bVar1) {
    testing::Message::Message(local_34e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__32.message_,(internal *)local_3430,
               (AssertionResult *)"Lexer(\"0x4B.e+0\"sv).takeF64()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_34f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x2a0,pcVar2);
    testing::internal::AssertHelper::operator=(&local_34f0,local_34e8);
    testing::internal::AssertHelper::~AssertHelper(&local_34f0);
    std::__cxx11::string::~string((string *)&gtest_ar__32.message_);
    testing::Message::~Message(local_34e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3430);
  local_3598 = sv("0x4B.E-0",8);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_3588,local_3598,&local_35c0);
  local_352c = ::wasm::WATParser::Lexer::takeF32();
  local_3521 = std::optional::operator_cast_to_bool((optional *)&local_352c);
  local_3521 = !local_3521;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_3520,&local_3521,(type *)0x0);
  ::wasm::WATParser::Lexer::~Lexer(&local_3588);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_35c0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3520);
  if (!bVar1) {
    testing::Message::Message(local_35d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__33.message_,(internal *)local_3520,
               (AssertionResult *)"Lexer(\"0x4B.E-0\"sv).takeF32()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_35d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x2a2,pcVar2);
    testing::internal::AssertHelper::operator=(&local_35d8,local_35d0);
    testing::internal::AssertHelper::~AssertHelper(&local_35d8);
    std::__cxx11::string::~string((string *)&gtest_ar__33.message_);
    testing::Message::~Message(local_35d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3520);
  local_3688 = sv("0x4B.E-0",8);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_3678,local_3688,&local_36b0);
  local_3618 = ::wasm::WATParser::Lexer::takeF64();
  local_3620 = extraout_XMM0_Qa_30;
  local_3609 = std::optional::operator_cast_to_bool((optional *)&local_3620);
  local_3609 = !local_3609;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_3608,&local_3609,(type *)0x0);
  ::wasm::WATParser::Lexer::~Lexer(&local_3678);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_36b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3608);
  if (!bVar1) {
    testing::Message::Message(local_36c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_36e8,(internal *)local_3608,
               (AssertionResult *)"Lexer(\"0x4B.E-0\"sv).takeF64()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_36c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x2a3,pcVar2);
    testing::internal::AssertHelper::operator=(&local_36c8,local_36c0);
    testing::internal::AssertHelper::~AssertHelper(&local_36c8);
    std::__cxx11::string::~string((string *)&local_36e8);
    testing::Message::~Message(local_36c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3608);
  return;
}

Assistant:

TEST(LexerTest, LexHexFloat) {

  EXPECT_EQ(Lexer("0x4B"sv).takeF32(), 0x4Bp0f);
  EXPECT_EQ(Lexer("0x4B"sv).takeF64(), 0x4Bp0);

  EXPECT_EQ(Lexer("0x4B."sv).takeF32(), 0x4B.p0f);
  EXPECT_EQ(Lexer("0x4B."sv).takeF64(), 0x4B.p0);

  EXPECT_EQ(Lexer("0x4B.5"sv).takeF32(), 0x4B.5p0f);
  EXPECT_EQ(Lexer("0x4B.5"sv).takeF64(), 0x4B.5p0);

  EXPECT_EQ(Lexer("0x4Bp0"sv).takeF32(), 0x4Bp0f);
  EXPECT_EQ(Lexer("0x4Bp0"sv).takeF64(), 0x4Bp0);

  EXPECT_EQ(Lexer("0x4B.p1"sv).takeF32(), 0x4B.p1f);
  EXPECT_EQ(Lexer("0x4B.p1"sv).takeF64(), 0x4B.p1);

  EXPECT_EQ(Lexer("0x4BP1"sv).takeF32(), 0x4BP1f);
  EXPECT_EQ(Lexer("0x4BP1"sv).takeF64(), 0x4BP1);

  EXPECT_EQ(Lexer("0x4Bp+2"sv).takeF32(), 0x4Bp+2f);
  EXPECT_EQ(Lexer("0x4Bp+2"sv).takeF64(), 0x4Bp+2);

  EXPECT_EQ(Lexer("0x4B.P-02"sv).takeF32(), 0x4B.P-02f);
  EXPECT_EQ(Lexer("0x4B.P-02"sv).takeF64(), 0x4B.P-02);

  EXPECT_EQ(Lexer("0x4B.0p0"sv).takeF32(), 0x4B.0p0f);
  EXPECT_EQ(Lexer("0x4B.0p0"sv).takeF64(), 0x4B.0p0);

  EXPECT_EQ(Lexer("0x4B.0P1"sv).takeF32(), 0x4B.0P1f);
  EXPECT_EQ(Lexer("0x4B.0P1"sv).takeF64(), 0x4B.0P1);

  EXPECT_EQ(Lexer("0x4B.0p+2"sv).takeF32(), 0x4B.0p+2f);
  EXPECT_EQ(Lexer("0x4B.0p+2"sv).takeF64(), 0x4B.0p+2);

  EXPECT_EQ(Lexer("0x4B.0P-2"sv).takeF32(), 0x4B.0P-2f);
  EXPECT_EQ(Lexer("0x4B.0P-2"sv).takeF64(), 0x4B.0P-2);

  EXPECT_EQ(Lexer("+0x4B.0p+2"sv).takeF32(), +0x4B.0p+2f);
  EXPECT_EQ(Lexer("+0x4B.0p+2"sv).takeF64(), +0x4B.0p+2);

  EXPECT_EQ(Lexer("-0x4B.0p+2"sv).takeF32(), -0x4B.0p+2f);
  EXPECT_EQ(Lexer("-0x4B.0p+2"sv).takeF64(), -0x4B.0p+2);

  EXPECT_EQ(Lexer("0x4_2.0_0p+0_2"sv).takeF32(), 0x42.00p+02f);
  EXPECT_EQ(Lexer("0x4_2.0_0p+0_2"sv).takeF64(), 0x42.00p+02);

  EXPECT_FALSE(Lexer("0x4Bjunk"sv).takeF32());
  EXPECT_FALSE(Lexer("0x4Bjunk"sv).takeF64());

  EXPECT_FALSE(Lexer("0x4B.junk"sv).takeF32());
  EXPECT_FALSE(Lexer("0x4B.junk"sv).takeF64());

  EXPECT_FALSE(Lexer("0x4B.0junk"sv).takeF32());
  EXPECT_FALSE(Lexer("0x4B.0junk"sv).takeF64());

  EXPECT_FALSE(Lexer("0x4B.Pjunk"sv).takeF32());
  EXPECT_FALSE(Lexer("0x4B.Pjunk"sv).takeF64());

  EXPECT_FALSE(Lexer("0x4B.p-junk"sv).takeF32());
  EXPECT_FALSE(Lexer("0x4B.p-junk"sv).takeF64());

  EXPECT_FALSE(Lexer("0x4B.p-10junk"sv).takeF32());
  EXPECT_FALSE(Lexer("0x4B.p-10junk"sv).takeF64());

  EXPECT_FALSE(Lexer("+0x"sv).takeF32());
  EXPECT_FALSE(Lexer("+0x"sv).takeF64());

  EXPECT_FALSE(Lexer("0x4Bp"sv).takeF32());
  EXPECT_FALSE(Lexer("0x4Bp"sv).takeF64());

  EXPECT_FALSE(Lexer("0x4BpABC"sv).takeF32());
  EXPECT_FALSE(Lexer("0x4BpABC"sv).takeF64());

  EXPECT_FALSE(Lexer("0x4Bp0xABC"sv).takeF32());
  EXPECT_FALSE(Lexer("0x4Bp0xABC"sv).takeF64());

  EXPECT_FALSE(Lexer("0x+0"sv).takeF32());
  EXPECT_FALSE(Lexer("0x+0"sv).takeF64());

  EXPECT_FALSE(Lexer("+-0x4B"sv).takeF32());
  EXPECT_FALSE(Lexer("+-0x4B"sv).takeF64());

  EXPECT_FALSE(Lexer("-+0x4B"sv).takeF32());
  EXPECT_FALSE(Lexer("-+0x4B"sv).takeF64());

  EXPECT_FALSE(Lexer("0x4Bp+-0"sv).takeF32());
  EXPECT_FALSE(Lexer("0x4Bp+-0"sv).takeF64());

  EXPECT_FALSE(Lexer("0x4Bp-+0"sv).takeF32());
  EXPECT_FALSE(Lexer("0x4Bp-+0"sv).takeF64());

  EXPECT_FALSE(Lexer("0x4B.e+0"sv).takeF32());
  EXPECT_FALSE(Lexer("0x4B.e+0"sv).takeF64());

  EXPECT_FALSE(Lexer("0x4B.E-0"sv).takeF32());
  EXPECT_FALSE(Lexer("0x4B.E-0"sv).takeF64());
}